

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O3

void dirSAVECPR(void)

{
  byte *__ptr;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  FILE *__s;
  size_t sVar5;
  CDevicePage *pCVar6;
  long lVar7;
  int num;
  ulong uVar8;
  uint uVar9;
  aint val;
  FILE *ff;
  path fnaam;
  undefined8 local_80;
  undefined4 local_78;
  long local_70 [2];
  FILE *local_60;
  path local_58;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  bVar1 = IsAmstradPLUSDevice(DeviceID);
  if (!bVar1) {
    Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode",(char *)0x0,SUPPRESS);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_58,&lp);
  cVar2 = std::filesystem::__cxx11::path::has_filename();
  if (cVar2 == '\0') {
    Error("[SAVECPR] CPR file name is empty",(char *)0x0,SUPPRESS);
    goto LAB_00113e05;
  }
  bVar1 = anyComma(&lp);
  uVar9 = 0x20;
  if (bVar1) {
    iVar3 = SkipBlanks();
    if (iVar3 != 0) {
      Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,SUPPRESS);
    }
    iVar3 = ParseExpression(&lp,(aint *)&local_80);
    if (iVar3 == 0) goto LAB_00113e05;
    uVar9 = (uint)local_80;
    if ((uint)local_80 - 0x21 < 0xffffffe0) {
      Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,SUPPRESS);
      goto LAB_00113e05;
    }
  }
  __s = (FILE *)SJ_fopen(&local_58,"wb");
  local_60 = __s;
  if (__s == (FILE *)0x0) {
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,local_58._M_pathname._M_dataplus._M_p,
               (anon_unknown_dwarf_22119 *)
               (local_58._M_pathname._M_dataplus._M_p +
               (long)(string_type *)local_58._M_pathname._M_string_length));
    Error("[SAVECPR] Error opening file for write",(char *)local_80,PASS3);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  else {
    local_80 = (long *)0x2020202046464952;
    local_78 = 0x21534d41;
    uVar4 = uVar9 * 0x4008 + 4;
    lVar7 = 4;
    do {
      *(char *)((long)&local_80 + lVar7) = (char)uVar4;
      uVar4 = uVar4 >> 8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    sVar5 = fwrite(&local_80,1,0xc,__s);
    if (sVar5 == 0xc) {
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          num = (int)uVar8;
          cVar2 = (char)(uVar8 / 10);
          local_80 = (long *)(CONCAT44(local_80._4_4_,
                                       CONCAT13((char)uVar8 + (cVar2 + (char)(uVar8 / 10)) * -5,
                                                CONCAT12(cVar2 + (char)((uVar8 / 10) * 0x1999999a >>
                                                                       0x20) * -10,0x6263))) |
                             0x30300000);
          pCVar6 = CDevice::GetPage(Device,num);
          iVar3 = pCVar6->Size;
          lVar7 = 4;
          do {
            *(char *)((long)&local_80 + lVar7) = (char)iVar3;
            iVar3 = iVar3 >> 8;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          sVar5 = fwrite(&local_80,1,8,__s);
          if (sVar5 != 8) goto LAB_00113d8f;
          pCVar6 = CDevice::GetPage(Device,num);
          __ptr = pCVar6->RAM;
          pCVar6 = CDevice::GetPage(Device,num);
          sVar5 = fwrite(__ptr,1,(long)pCVar6->Size,__s);
          pCVar6 = CDevice::GetPage(Device,num);
          if (pCVar6->Size != (int)sVar5) goto LAB_00113d8f;
          uVar8 = (ulong)(num + 1U);
        } while (num + 1U != uVar9);
      }
      fclose(__s);
      goto LAB_00113e05;
    }
LAB_00113d8f:
    anon_unknown.dwarf_22119::writeError
              ((anon_unknown_dwarf_22119 *)local_58._M_pathname._M_dataplus._M_p,
               (path *)local_58._M_pathname._M_string_length,(FILE **)&local_60);
  }
  Error("[SAVECPR] Error writing file (Disk full?)",(char *)0x0,IF_FIRST);
LAB_00113e05:
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void dirSAVECPR() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	if (!IsAmstradPLUSDevice(DeviceID)) {
		Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode", NULL, SUPPRESS);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[SAVECPR] CPR file name is empty", NULL, SUPPRESS);
		return;
	}
	int cprSize = 32;
	if (anyComma(lp)) {
		if (SkipBlanks()) Error(err_txt_size, NULL, SUPPRESS);	// return will happen on ParseExpression
		aint val;
		if (!ParseExpression(lp, val)) return;
		if ((val < 1) || (val > 32)) {
			Error(err_txt_size, NULL, SUPPRESS);
			return;
		}
		cprSize = val;
	}
	if (!SaveCPR(fnaam, cprSize)) Error("[SAVECPR] Error writing file (Disk full?)", NULL, IF_FIRST);
}